

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_storage_client.cc
# Opt level: O0

Future<int> * __thiscall
NarpcStorageClient::ReadData
          (NarpcStorageClient *this,int key,longlong address,shared_ptr<crail::ByteBuffer> *buf)

{
  int iVar1;
  element_type *this_00;
  longlong *in_RSI;
  Future<int> *in_RDI;
  int *in_R8;
  shared_ptr<NarpcReadResponse> response;
  shared_ptr<NarpcReadRequest> request;
  shared_ptr<NarpcReadRequest> *in_stack_ffffffffffffff18;
  int val;
  shared_ptr<AsyncTask<int>_> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *task;
  Future<int> *this_02;
  Future<int> *__args;
  shared_ptr<NarpcReadResponse> local_a0;
  undefined4 local_8c;
  Future<int> local_88;
  longlong *local_58;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffffb0;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  
  __args = in_RDI;
  this_00 = std::__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x172d8a);
  iVar1 = crail::ByteBuffer::remaining(this_00);
  std::make_shared<NarpcReadRequest,int&,long_long&,int>(in_R8,in_RSI,(int *)__args);
  local_58 = in_RSI + 1;
  std::make_shared<NarpcReadResponse,RpcClient*,std::shared_ptr<crail::ByteBuffer>&>
            ((RpcClient **)__args,(shared_ptr<crail::ByteBuffer> *)in_RDI);
  this_01 = (shared_ptr<AsyncTask<int>_> *)(in_RSI + 1);
  task = &local_88.task_.super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<RpcMessage>::shared_ptr<NarpcReadRequest,void>
            ((shared_ptr<RpcMessage> *)this_01,in_stack_ffffffffffffff18);
  this_02 = &local_88;
  std::shared_ptr<RpcMessage>::shared_ptr<NarpcReadResponse,void>
            ((shared_ptr<RpcMessage> *)this_01,
             (shared_ptr<NarpcReadResponse> *)in_stack_ffffffffffffff18);
  val = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  iVar1 = RpcClient::IssueRequest
                    ((RpcClient *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::shared_ptr<RpcMessage>::~shared_ptr((shared_ptr<RpcMessage> *)0x172e4b);
  std::shared_ptr<RpcMessage>::~shared_ptr((shared_ptr<RpcMessage> *)0x172e55);
  if (iVar1 < 0) {
    Future<int>::Failure(val);
  }
  else {
    std::shared_ptr<AsyncTask<int>>::shared_ptr<NarpcReadResponse,void>(this_01,&local_a0);
    Future<int>::Future(this_02,(shared_ptr<AsyncTask<int>_> *)task);
    std::shared_ptr<AsyncTask<int>_>::~shared_ptr((shared_ptr<AsyncTask<int>_> *)0x172f0b);
  }
  local_8c = 1;
  std::shared_ptr<NarpcReadResponse>::~shared_ptr((shared_ptr<NarpcReadResponse> *)0x172f42);
  std::shared_ptr<NarpcReadRequest>::~shared_ptr((shared_ptr<NarpcReadRequest> *)0x172f4f);
  return __args;
}

Assistant:

Future<int> NarpcStorageClient::ReadData(int key, long long address,
                                         shared_ptr<ByteBuffer> buf) {
  shared_ptr<NarpcReadRequest> request =
      make_shared<NarpcReadRequest>(key, address, buf->remaining());
  shared_ptr<NarpcReadResponse> response =
      make_shared<NarpcReadResponse>(&rpc_client_, buf);

  if (rpc_client_.IssueRequest(request, response) < 0) {
    return Future<int>::Failure(-1);
  }
  return Future<int>(response);
}